

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

void __thiscall
soplex::SoPlexBase<double>::getRowVectorReal
          (SoPlexBase<double> *this,int i,DSVectorBase<double> *row)

{
  int iVar1;
  SPxLPBase<double> *pSVar2;
  Item *pIVar3;
  
  pSVar2 = this->_realLP;
  pIVar3 = (pSVar2->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
  iVar1 = (pSVar2->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[i].idx;
  if (pSVar2->_isScaled == true) {
    DSVectorBase<double>::setMax(row,pIVar3[iVar1].data.super_SVectorBase<double>.memused);
    (*this->_scaler->_vptr_SPxScaler[0x1a])(this->_scaler,this->_realLP,i,row);
    return;
  }
  DSVectorBase<double>::operator=(row,(SVectorBase<double> *)(pIVar3 + iVar1));
  return;
}

Assistant:

void SoPlexBase<R>::getRowVectorReal(int i, DSVectorBase<R>& row) const
{
   assert(_realLP);

   if(_realLP->isScaled())
   {
      assert(_scaler);
      row.setMax(_realLP->rowVector(i).size());
      _scaler->getRowUnscaled(*_realLP, i, row);
   }
   else
      row = _realLP->rowVector(i);
}